

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_1;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *args_3;
  ForeachLoopListSyntax *pFVar1;
  DeepCloneVisitor visitor;
  Token local_70;
  Token local_60;
  Token local_50;
  Token local_40;
  
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  args_1 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x28),(DeepCloneVisitor *)&local_70,
                      (BumpAllocator *)__child_stack);
  local_70 = parsing::Token::deepClone((Token *)(__fn + 0x30),(BumpAllocator *)__child_stack);
  args_3 = deepClone<slang::syntax::NameSyntax>
                     ((SeparatedSyntaxList<slang::syntax::NameSyntax> *)(__fn + 0x40),
                      (BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x78),(BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0x88),(BumpAllocator *)__child_stack);
  pFVar1 = BumpAllocator::
           emplace<slang::syntax::ForeachLoopListSyntax,slang::parsing::Token,slang::syntax::NameSyntax&,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>&,slang::parsing::Token,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_40,(NameSyntax *)args_1,&local_70,args_3
                      ,&local_50,&local_60);
  return (int)pFVar1;
}

Assistant:

static SyntaxNode* clone(const ForeachLoopListSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ForeachLoopListSyntax>(
        node.openParen.deepClone(alloc),
        *deepClone<NameSyntax>(*node.arrayName, alloc),
        node.openBracket.deepClone(alloc),
        *deepClone(node.loopVariables, alloc),
        node.closeBracket.deepClone(alloc),
        node.closeParen.deepClone(alloc)
    );
}